

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

int glfwInit(void)

{
  int iVar1;
  GLFWbool GVar2;
  char *string;
  char **ppcVar3;
  
  if (_glfw.initialized == 0) {
    memset(&_glfw,0,0x21078);
    _glfw.hints.init.hatButtons = _glfwInitHints.hatButtons;
    _glfw.hints.init.ns.menubar = _glfwInitHints.ns.menubar;
    _glfw.hints.init.ns.chdir = _glfwInitHints.ns.chdir;
    iVar1 = _glfwPlatformInit();
    if ((((iVar1 == 0) || (GVar2 = _glfwPlatformCreateMutex(&_glfw.errorLock), GVar2 == 0)) ||
        (GVar2 = _glfwPlatformCreateTls(&_glfw.errorSlot), GVar2 == 0)) ||
       (GVar2 = _glfwPlatformCreateTls(&_glfw.contextSlot), GVar2 == 0)) {
LAB_0011d184:
      terminate();
      return 0;
    }
    _glfwPlatformSetTls(&_glfw.errorSlot,&_glfwMainThreadError);
    _glfw.initialized = 1;
    _glfw.timer.offset = _glfwPlatformGetTimerValue();
    glfwDefaultWindowHints();
    if (_glfwDefaultMappings[0] != (char *)0x0) {
      ppcVar3 = _glfwDefaultMappings;
      string = _glfwDefaultMappings[0];
      do {
        ppcVar3 = ppcVar3 + 1;
        iVar1 = glfwUpdateGamepadMappings(string);
        if (iVar1 == 0) goto LAB_0011d184;
        string = *ppcVar3;
      } while (string != (char *)0x0);
    }
  }
  return 1;
}

Assistant:

GLFWAPI int glfwInit(void)
{
    if (_glfw.initialized)
        return GLFW_TRUE;

    memset(&_glfw, 0, sizeof(_glfw));
    _glfw.hints.init = _glfwInitHints;

    if (!_glfwPlatformInit())
    {
        terminate();
        return GLFW_FALSE;
    }

    if (!_glfwPlatformCreateMutex(&_glfw.errorLock) ||
        !_glfwPlatformCreateTls(&_glfw.errorSlot) ||
        !_glfwPlatformCreateTls(&_glfw.contextSlot))
    {
        terminate();
        return GLFW_FALSE;
    }

    _glfwPlatformSetTls(&_glfw.errorSlot, &_glfwMainThreadError);

    _glfw.initialized = GLFW_TRUE;
    _glfw.timer.offset = _glfwPlatformGetTimerValue();

    glfwDefaultWindowHints();

    {
        int i;

        for (i = 0;  _glfwDefaultMappings[i];  i++)
        {
            if (!glfwUpdateGamepadMappings(_glfwDefaultMappings[i]))
            {
                terminate();
                return GLFW_FALSE;
            }
        }
    }

    return GLFW_TRUE;
}